

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

int __thiscall SBarInfo::newImage(SBarInfo *this,char *patchname)

{
  FString *pFVar1;
  int iVar2;
  uint uVar3;
  uint i;
  ulong uVar4;
  FString local_30;
  
  uVar4 = 0xffffffffffffffff;
  if (*patchname != '\0') {
    iVar2 = strcasecmp(patchname,"nullimage");
    if (iVar2 != 0) {
      uVar3 = (this->Images).Count;
      pFVar1 = (this->Images).Array;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = strcasecmp(pFVar1[uVar4].Chars,patchname);
        if (iVar2 == 0) goto LAB_004b1da7;
      }
      FString::FString(&local_30,patchname);
      uVar3 = TArray<FString,_FString>::Push(&this->Images,&local_30);
      uVar4 = (ulong)uVar3;
      FString::~FString(&local_30);
    }
  }
LAB_004b1da7:
  return (int)uVar4;
}

Assistant:

int SBarInfo::newImage(const char *patchname)
{
	if(patchname[0] == '\0' || stricmp(patchname, "nullimage") == 0)
	{
		return -1;
	}
	for(unsigned int i = 0;i < this->Images.Size();i++) //did we already load it?
	{
		if(stricmp(this->Images[i], patchname) == 0)
		{
			return i;
		}
	}
	return this->Images.Push(patchname);
}